

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CDict * ZSTD_createCDict(void *dict,size_t dictSize,int compressionLevel)

{
  ZSTD_CDict *pZVar1;
  int in_EDX;
  undefined8 in_RDI;
  size_t unaff_retaddr;
  unsigned_long_long in_stack_00000008;
  int in_stack_00000014;
  ZSTD_CDict *cdict;
  ZSTD_compressionParameters cParams;
  ZSTD_dictContentType_e in_stack_00000080;
  ZSTD_dictLoadMethod_e in_stack_00000084;
  size_t in_stack_00000088;
  void *in_stack_00000090;
  undefined1 in_stack_000000a0 [28];
  undefined1 in_stack_000000c0 [24];
  int local_3c;
  
  ZSTD_getCParams_internal
            (in_stack_00000014,in_stack_00000008,unaff_retaddr,
             (ZSTD_cParamMode_e)((ulong)in_RDI >> 0x20));
  pZVar1 = ZSTD_createCDict_advanced
                     (in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000080,
                      (ZSTD_compressionParameters)in_stack_000000a0,
                      (ZSTD_customMem)in_stack_000000c0);
  if (pZVar1 != (ZSTD_CDict *)0x0) {
    local_3c = in_EDX;
    if (in_EDX == 0) {
      local_3c = 3;
    }
    pZVar1->compressionLevel = local_3c;
  }
  return pZVar1;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict(const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters cParams = ZSTD_getCParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    ZSTD_CDict* const cdict = ZSTD_createCDict_advanced(dict, dictSize,
                                                  ZSTD_dlm_byCopy, ZSTD_dct_auto,
                                                  cParams, ZSTD_defaultCMem);
    if (cdict)
        cdict->compressionLevel = (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : compressionLevel;
    return cdict;
}